

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::Harness_SimpleMulti_Test::TestBody(Harness_SimpleMulti_Test *this)

{
  int iVar1;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_39;
  string local_38;
  Random local_18;
  int local_14;
  Random rnd;
  int i;
  Harness_SimpleMulti_Test *this_local;
  
  _rnd = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + (long)local_14 * 0xc));
    iVar1 = test::RandomSeed();
    Random::Random(&local_18,iVar1 + 3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"abc",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"v",&local_61);
    Harness::Add(&this->super_Harness,&local_38,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"abcd",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"v",&local_b1);
    Harness::Add(&this->super_Harness,&local_88,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"ac",&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"v2",&local_101);
    Harness::Add(&this->super_Harness,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    Harness::Test(&this->super_Harness,&local_18);
  }
  return;
}

Assistant:

TEST_F(Harness, SimpleMulti) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 3);
    Add("abc", "v");
    Add("abcd", "v");
    Add("ac", "v2");
    Test(&rnd);
  }
}